

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

int Cnf_IsopCountLiterals(Vec_Int_t *vIsop,int nVars)

{
  int iVar1;
  undefined4 local_24;
  undefined4 local_20;
  int b;
  int i;
  int Cube;
  int nLits;
  int nVars_local;
  Vec_Int_t *vIsop_local;
  
  i = 0;
  for (local_20 = 0; iVar1 = Vec_IntSize(vIsop), local_20 < iVar1; local_20 = local_20 + 1) {
    b = Vec_IntEntry(vIsop,local_20);
    for (local_24 = 0; local_24 < nVars; local_24 = local_24 + 1) {
      if (((b & 3U) == 1) || ((b & 3U) == 2)) {
        i = i + 1;
      }
      b = b >> 2;
    }
  }
  return i;
}

Assistant:

int Cnf_IsopCountLiterals( Vec_Int_t * vIsop, int nVars )
{
    int nLits = 0, Cube, i, b;
    Vec_IntForEachEntry( vIsop, Cube, i )
    {
        for ( b = 0; b < nVars; b++ )
        {
            if ( (Cube & 3) == 1 || (Cube & 3) == 2 )
                nLits++;
            Cube >>= 2;
        }
    }
    return nLits;
}